

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O3

result<toml::basic_value<toml::type_config>,_toml::error_info> *
toml::detail::parse_ml_basic_string<toml::type_config>
          (result<toml::basic_value<toml::type_config>,_toml::error_info> *__return_storage_ptr__,
          location *loc,context<toml::type_config> *ctx)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer puVar2;
  long lVar3;
  value_type *pvVar4;
  error_type *this;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  in_RCX;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  last;
  size_type __n;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  first_00;
  basic_value<toml::type_config> *v;
  error_info *v_00;
  string_format_info fmt;
  basic_value<toml::type_config> *ctx_00;
  EVP_PKEY_CTX *pEVar5;
  _Alloc_hider this_00;
  size_t sVar6;
  string_type val;
  string str;
  region reg;
  location loc2;
  result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::error_info>
  esc;
  location first;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_508;
  string local_4e8;
  string_type local_4c8;
  string local_4a8;
  string local_488;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_468;
  region local_448;
  undefined1 local_3d8 [48];
  size_t local_3a8;
  undefined1 local_390 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_380;
  vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_370;
  undefined8 local_358;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_348 [6];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vStack_2e0;
  sequence local_2c8;
  region_type local_2a8;
  location local_238;
  location local_1f0;
  failure<toml::error_info> local_1a8;
  basic_value<toml::type_config> local_150;
  failure<toml::error_info> local_88;
  
  location::location(&local_1f0,loc);
  syntax::ml_basic_string((sequence *)local_390,&ctx->toml_spec_);
  sequence::scan(&local_448,(sequence *)local_390,loc);
  std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
  ~vector((vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_> *)
          (local_390 + 8));
  if (local_448.source_.
      super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr == (element_type *)0x0) {
    local_488._M_dataplus._M_p = (pointer)&local_488.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_488,"toml::parse_ml_basic_string: invalid string format","");
    syntax::ml_basic_string((sequence *)local_3d8,&ctx->toml_spec_);
    location::location(&local_238,loc);
    local_4a8._M_dataplus._M_p = (pointer)&local_4a8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_4a8,"");
    make_syntax_error<toml::detail::sequence>
              ((error_info *)local_390,&local_488,(sequence *)local_3d8,&local_238,&local_4a8);
    err<toml::error_info>(&local_88,(error_info *)local_390);
    __return_storage_ptr__->is_ok_ = false;
    failure<toml::error_info>::failure
              ((failure<toml::error_info> *)&(__return_storage_ptr__->field_1).succ_,&local_88);
    failure<toml::error_info>::~failure(&local_88);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_358 != local_348) {
      operator_delete((void *)local_358,local_348[0]._M_allocated_capacity + 1);
    }
    std::
    vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~vector(&local_370);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_390._1_7_,local_390[0]) != &local_380) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_390._1_7_,local_390[0]),
                      (ulong)(local_380._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4a8._M_dataplus._M_p != &local_4a8.field_2) {
      operator_delete(local_4a8._M_dataplus._M_p,local_4a8.field_2._M_allocated_capacity + 1);
    }
    location::~location(&local_238);
    std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
    ~vector((vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_> *
            )(local_3d8 + 8));
    local_4e8._M_dataplus._M_p = local_488._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_488._M_dataplus._M_p == &local_488.field_2) goto LAB_003ca902;
  }
  else {
    puVar2 = ((local_448.source_.
               super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr)->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_start;
    make_string<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
              (&local_4e8,(detail *)(puVar2 + local_448.first_),
               (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                )(puVar2 + local_448.last_),in_RCX);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_4e8,0,3);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_4e8,
               (size_type)(local_4e8._M_string_length + -3),3);
    fmt.fmt = multiline_basic;
    fmt.start_with_newline = false;
    last._M_current = (char *)local_4e8._M_string_length;
    if ((char *)local_4e8._M_string_length != (char *)0x0) {
      __n = 1;
      if ((*local_4e8._M_dataplus._M_p == '\n') ||
         ((last._M_current =
                (char *)CONCAT71((int7)(local_4e8._M_string_length >> 8),
                                 (char *)local_4e8._M_string_length == (char *)0x1),
          *local_4e8._M_dataplus._M_p == '\r' && (char *)local_4e8._M_string_length != (char *)0x1
          && (__n = 2, local_4e8._M_dataplus._M_p[1] == '\n')))) {
        fmt.fmt = multiline_basic;
        fmt.start_with_newline = true;
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_4e8,0
                   ,__n);
      }
    }
    local_508._M_dataplus._M_p = (pointer)&local_508.field_2;
    local_508._M_string_length = 0;
    local_508.field_2._M_local_buf[0] = '\0';
    if ((char *)local_4e8._M_string_length == (char *)0x0) {
LAB_003ca723:
      local_4c8._M_dataplus._M_p = (pointer)&local_4c8.field_2;
      local_4c8.field_2._M_allocated_capacity =
           CONCAT71(local_508.field_2._M_allocated_capacity._1_7_,local_508.field_2._M_local_buf[0])
      ;
      local_4c8.field_2._8_8_ = local_508.field_2._8_8_;
    }
    else {
      first_00._M_current = (char *)(local_4e8._M_string_length + (long)local_4e8._M_dataplus._M_p);
      this_00._M_p = local_4e8._M_dataplus._M_p;
      do {
        if (*this_00._M_p == '\\') {
          make_string<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                    ((string *)local_390,(detail *)this_00._M_p,first_00,last);
          make_temporary_location((location *)local_3d8,(string *)local_390);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT71(local_390._1_7_,local_390[0]) != &local_380) {
            operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)CONCAT71(local_390._1_7_,local_390[0]),
                            (ulong)(local_380._M_allocated_capacity + 1));
          }
          syntax::escaped_newline(&local_2c8,&ctx->toml_spec_);
          sequence::scan((region *)local_390,&local_2c8,(location *)local_3d8);
          lVar3 = CONCAT71(local_390._1_7_,local_390[0]);
          region::~region((region *)local_390);
          std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
          ::~vector(&local_2c8.others_);
          sVar6 = local_3a8;
          if (lVar3 == 0) {
            parse_escape_sequence<toml::type_config>
                      ((result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::error_info>
                        *)local_390,(location *)local_3d8,ctx);
            if (local_390[0] == false) {
              this = result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::error_info>
                     ::unwrap_err((result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::error_info>
                                   *)local_390,(source_location)0x556060);
              err<toml::error_info&>(&local_1a8,(toml *)this,v_00);
              __return_storage_ptr__->is_ok_ = false;
              pEVar5 = (EVP_PKEY_CTX *)&local_1a8;
              failure<toml::error_info>::failure
                        ((failure<toml::error_info> *)&(__return_storage_ptr__->field_1).succ_,
                         &local_1a8);
              failure<toml::error_info>::~failure(&local_1a8);
              result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::error_info>
              ::cleanup((result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::error_info>
                         *)local_390,pEVar5);
              location::~location((location *)local_3d8);
              goto LAB_003ca8cb;
            }
            pvVar4 = result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::error_info>
                     ::unwrap((result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::error_info>
                               *)local_390,(source_location)0x556078);
            pEVar5 = (EVP_PKEY_CTX *)(pvVar4->_M_dataplus)._M_p;
            CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            _M_append(&local_508,(char *)pEVar5,pvVar4->_M_string_length);
            sVar6 = local_3a8;
            result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::error_info>
            ::cleanup((result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::error_info>
                       *)local_390,pEVar5);
          }
          this_00._M_p = this_00._M_p + sVar6;
          location::~location((location *)local_3d8);
        }
        else {
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          push_back(&local_508,*this_00._M_p);
          this_00._M_p = this_00._M_p + 1;
        }
        first_00._M_current = local_4e8._M_dataplus._M_p + local_4e8._M_string_length;
      } while (this_00._M_p != first_00._M_current);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_508._M_dataplus._M_p == &local_508.field_2) goto LAB_003ca723;
      local_4c8._M_dataplus._M_p = local_508._M_dataplus._M_p;
      local_4c8.field_2._M_allocated_capacity =
           CONCAT71(local_508.field_2._M_allocated_capacity._1_7_,local_508.field_2._M_local_buf[0])
      ;
    }
    local_508._M_dataplus._M_p = (pointer)&local_508.field_2;
    local_4c8._M_string_length = local_508._M_string_length;
    local_508._M_string_length = 0;
    local_508.field_2._M_local_buf[0] = '\0';
    local_468.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_468.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_468.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    paVar1 = &local_448.source_name_.field_2;
    local_2a8.source_name_._M_dataplus._M_p = (pointer)&local_2a8.source_name_.field_2;
    local_2a8.source_.
    super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = local_448.source_.
              super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr;
    local_2a8.source_.
    super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi =
         local_448.source_.
         super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
         ._M_refcount._M_pi;
    local_448.source_.
    super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)0x0;
    local_448.source_.
    super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_448.source_name_._M_dataplus._M_p == paVar1) {
      local_2a8.source_name_.field_2._8_8_ = local_448.source_name_.field_2._8_8_;
    }
    else {
      local_2a8.source_name_._M_dataplus._M_p = local_448.source_name_._M_dataplus._M_p;
    }
    local_2a8.source_name_._M_string_length = local_448.source_name_._M_string_length;
    local_448.source_name_._M_string_length = 0;
    local_448.source_name_.field_2._M_local_buf[0] = '\0';
    local_2a8.length_ = local_448.length_;
    local_2a8.first_ = local_448.first_;
    local_2a8.first_line_ = local_448.first_line_;
    local_2a8.first_column_ = local_448.first_column_;
    local_2a8.last_ = local_448.last_;
    local_2a8.last_line_ = local_448.last_line_;
    local_2a8.last_column_ = local_448.last_column_;
    local_448.source_name_._M_dataplus._M_p = (pointer)paVar1;
    basic_value<toml::type_config>::basic_value
              ((basic_value<toml::type_config> *)local_390,&local_4c8,fmt,&local_468,&local_2a8);
    ok<toml::basic_value<toml::type_config>>
              ((success<toml::basic_value<toml::type_config>_> *)&local_150,(toml *)local_390,v);
    __return_storage_ptr__->is_ok_ = true;
    ctx_00 = &local_150;
    basic_value<toml::type_config>::basic_value
              (&(__return_storage_ptr__->field_1).succ_.value,&local_150);
    basic_value<toml::type_config>::cleanup(&local_150,(EVP_PKEY_CTX *)ctx_00);
    CLI::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_150.comments_);
    region::~region(&local_150.region_);
    basic_value<toml::type_config>::cleanup
              ((basic_value<toml::type_config> *)local_390,(EVP_PKEY_CTX *)ctx_00);
    CLI::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&vStack_2e0);
    region::~region((region *)local_348);
    region::~region(&local_2a8);
    CLI::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_468);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4c8._M_dataplus._M_p != &local_4c8.field_2) {
      operator_delete(local_4c8._M_dataplus._M_p,local_4c8.field_2._M_allocated_capacity + 1);
    }
LAB_003ca8cb:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_508._M_dataplus._M_p != &local_508.field_2) {
      operator_delete(local_508._M_dataplus._M_p,
                      CONCAT71(local_508.field_2._M_allocated_capacity._1_7_,
                               local_508.field_2._M_local_buf[0]) + 1);
    }
    local_488.field_2._M_allocated_capacity = local_4e8.field_2._M_allocated_capacity;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4e8._M_dataplus._M_p == &local_4e8.field_2) goto LAB_003ca902;
  }
  operator_delete(local_4e8._M_dataplus._M_p,local_488.field_2._M_allocated_capacity + 1);
LAB_003ca902:
  region::~region(&local_448);
  location::~location(&local_1f0);
  return __return_storage_ptr__;
}

Assistant:

result<basic_value<TC>, error_info>
parse_ml_basic_string(location& loc, const context<TC>& ctx)
{
    const auto first = loc;
    const auto& spec = ctx.toml_spec();

    string_format_info fmt;
    fmt.fmt = string_format::multiline_basic;

    auto reg = syntax::ml_basic_string(spec).scan(loc);
    if( ! reg.is_ok())
    {
        return err(make_syntax_error("toml::parse_ml_basic_string: "
            "invalid string format",
            syntax::ml_basic_string(spec), loc));
    }

    // ----------------------------------------------------------------------
    // it matches. gen value

    auto str = reg.as_string();

    // we already checked that it starts with """ and ends with """.
    assert(str.substr(0, 3) == "\"\"\"");
    str.erase(0, 3);

    assert(str.size() >= 3);
    assert(str.substr(str.size()-3, 3) == "\"\"\"");
    str.erase(str.size()-3, 3);

    // the first newline just after """ is trimmed
    if(str.size() >= 1 && str.at(0) == '\n')
    {
        str.erase(0, 1);
        fmt.start_with_newline = true;
    }
    else if(str.size() >= 2 && str.at(0) == '\r' && str.at(1) == '\n')
    {
        str.erase(0, 2);
        fmt.start_with_newline = true;
    }

    using string_type = typename basic_value<TC>::string_type;
    string_type val;
    {
        auto iter = str.cbegin();
        while(iter != str.cend())
        {
            if(*iter == '\\') // remove whitespaces around escaped-newline
            {
                // we assume that the string is not too long to copy
                auto loc2 = make_temporary_location(make_string(iter, str.cend()));
                if(syntax::escaped_newline(spec).scan(loc2).is_ok())
                {
                    std::advance(iter, loc2.get_location()); // skip escaped newline and indent
                    // now iter points non-WS char
                    assert(iter == str.end() || (*iter != ' ' && *iter != '\t'));
                }
                else // normal escape seq.
                {
                    auto esc = parse_escape_sequence(loc2, ctx);

                    // syntax does not check its value. the unicode codepoint may be
                    // invalid, e.g. out-of-bound, [0xD800, 0xDFFF]
                    if(esc.is_err())
                    {
                        return err(esc.unwrap_err());
                    }

                    val += esc.unwrap();
                    std::advance(iter, loc2.get_location());
                }
            }
            else // we already checked the syntax. we don't need to check it again.
            {
                val += static_cast<typename string_type::value_type>(*iter);
                ++iter;
            }
        }
    }

    return ok(basic_value<TC>(
            std::move(val), std::move(fmt), {}, std::move(reg)
        ));
}